

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.h
# Opt level: O0

void __thiscall sptk::reaper::LpcAnalyzer::~LpcAnalyzer(LpcAnalyzer *this)

{
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  
  std::vector<float,_std::allocator<float>_>::~vector(unaff_retaddr);
  std::vector<float,_std::allocator<float>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

~LpcAnalyzer(void) { }